

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintserialize.h
# Opt level: O2

ssize_t bsplib::UIntSerialize<unsigned_long>::read(int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined4 in_register_0000003c;
  
  *(undefined8 *)__buf = 0;
  lVar3 = 1;
  lVar2 = 0;
  lVar4 = 0;
  do {
    bVar1 = *(byte *)(CONCAT44(in_register_0000003c,__fd) + lVar2);
    lVar2 = lVar2 + 1;
    lVar4 = lVar4 + (ulong)(bVar1 & 0x7f) * lVar3;
    *(long *)__buf = lVar4;
    lVar3 = lVar3 << 7;
  } while ((char)bVar1 < '\0');
  return lVar2;
}

Assistant:

static int read( const unsigned char * cs, UInt & x ) {
        x = 0;
        int i = 0;
        unsigned char m = (1 << (CHAR_BIT-1));
        unsigned char c = 0;
        UInt power = 1;
        do {
            c = cs[i++];
            x += power * (c & (m-1));
            power <<= (CHAR_BIT-1);
        } while (c & m);

        return i;
    }